

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O2

void evsig_free_globals_(void)

{
  if (evsig_base_lock != (void *)0x0) {
    if (evthread_lock_fns_.free != (_func_void_void_ptr_uint *)0x0) {
      (*evthread_lock_fns_.free)(evsig_base_lock,0);
    }
    evsig_base_lock = (void *)0x0;
  }
  return;
}

Assistant:

static void
evsig_free_globals_locks(void)
{
#ifndef EVENT__DISABLE_THREAD_SUPPORT
	if (evsig_base_lock != NULL) {
		EVTHREAD_FREE_LOCK(evsig_base_lock, 0);
		evsig_base_lock = NULL;
	}
#endif
	return;
}